

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

void inplace_flip_container(roaring_array_t *x1_arr,uint16_t hb,uint16_t lb_start,uint16_t lb_end)

{
  uint32_t range_start;
  int iVar1;
  container_t *pcVar2;
  roaring_array_t *ra;
  undefined2 in_CX;
  undefined2 in_DX;
  undefined2 in_SI;
  roaring_array_t *in_RDI;
  container_t *container_to_flip;
  container_t *flipped_container;
  uint8_t ctype_out;
  uint8_t ctype_in;
  int i;
  roaring_array_t *in_stack_ffffffffffffffd8;
  int32_t i_00;
  uint8_t *result_type;
  uint8_t uVar3;
  uint32_t in_stack_ffffffffffffffe8;
  undefined2 in_stack_fffffffffffffff0;
  undefined1 uVar4;
  uint8_t type;
  
  uVar4 = (undefined1)in_SI;
  type = (uint8_t)((ushort)in_SI >> 8);
  range_start = ra_get_index(in_stack_ffffffffffffffd8,0);
  uVar3 = (uint8_t)((ulong)in_stack_ffffffffffffffd8 >> 0x38);
  result_type = (uint8_t *)0x0;
  if ((int)range_start < 0) {
    pcVar2 = container_range_of_ones(range_start,in_stack_ffffffffffffffe8,(uint8_t *)0x0);
    ra_insert_new_key_value_at
              ((roaring_array_t *)
               CONCAT17(type,CONCAT16(uVar4,CONCAT24(in_DX,CONCAT22(in_CX,in_stack_fffffffffffffff0)
                                                    ))),range_start,
               (uint16_t)(in_stack_ffffffffffffffe8 >> 0x10),pcVar2,uVar3);
  }
  else {
    pcVar2 = ra_get_container_at_index(in_RDI,(uint16_t)range_start,&stack0xffffffffffffffeb);
    uVar3 = (uint8_t)(in_stack_ffffffffffffffe8 >> 0x10);
    ra = (roaring_array_t *)
         container_inot_range
                   (in_RDI,type,CONCAT22(in_CX,in_stack_fffffffffffffff0),range_start,result_type);
    iVar1 = container_get_cardinality(pcVar2,'\0');
    i_00 = (int32_t)((ulong)pcVar2 >> 0x20);
    if (iVar1 == 0) {
      container_free(ra,(uint8_t)((ulong)pcVar2 >> 0x38));
      ra_remove_at_index(ra,i_00);
    }
    else {
      ra_set_container_at_index(in_RDI,range_start,ra,uVar3);
    }
  }
  return;
}

Assistant:

static void inplace_flip_container(roaring_array_t *x1_arr, uint16_t hb,
                                   uint16_t lb_start, uint16_t lb_end) {
    const int i = ra_get_index(x1_arr, hb);
    uint8_t ctype_in, ctype_out;
    container_t *flipped_container = NULL;
    if (i >= 0) {
        container_t *container_to_flip =
            ra_get_container_at_index(x1_arr, (uint16_t)i, &ctype_in);
        flipped_container = container_inot_range(
            container_to_flip, ctype_in, (uint32_t)lb_start,
            (uint32_t)(lb_end + 1), &ctype_out);
        // if a new container was created, the old one was already freed
        if (container_get_cardinality(flipped_container, ctype_out)) {
            ra_set_container_at_index(x1_arr, i, flipped_container, ctype_out);
        } else {
            container_free(flipped_container, ctype_out);
            ra_remove_at_index(x1_arr, i);
        }

    } else {
        flipped_container = container_range_of_ones(
            (uint32_t)lb_start, (uint32_t)(lb_end + 1), &ctype_out);
        ra_insert_new_key_value_at(x1_arr, -i - 1, hb, flipped_container,
                                   ctype_out);
    }
}